

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

void __thiscall ON_XMLVariant::SetValue(ON_XMLVariant *this,ON_4fColor *c)

{
  float fVar1;
  ON_4fColor *c_local;
  ON_XMLVariant *this_local;
  
  (*this->_vptr_ON_XMLVariant[0xd])();
  this->_private->_type = DoubleColor4;
  fVar1 = ON_4fColor::Red(c);
  (this->_private->field_2)._double_val = (double)fVar1;
  fVar1 = ON_4fColor::Green(c);
  (this->_private->field_2).m_xform.m_xform[0][1] = (double)fVar1;
  fVar1 = ON_4fColor::Blue(c);
  (this->_private->field_2).m_xform.m_xform[0][2] = (double)fVar1;
  fVar1 = ON_4fColor::Alpha(c);
  (this->_private->field_2).m_xform.m_xform[0][3] = (double)fVar1;
  this->_private->_varies = false;
  this->_private->_type_pending = false;
  return;
}

Assistant:

void ON_XMLVariant::SetValue(const ON_4fColor& c)
{
  ClearBuffers();

  _private->_type = Types::DoubleColor4;

  _private->_array_val[0] = c.Red();
  _private->_array_val[1] = c.Green();
  _private->_array_val[2] = c.Blue();
  _private->_array_val[3] = c.Alpha();

  _private->_varies = false;
  _private->_type_pending = false;
}